

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbj.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  int iVar1;
  int extraout_EAX;
  char *pcVar2;
  uint uVar3;
  FILE *this;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar4;
  double dVar5;
  double dVar6;
  BandStop local_b8;
  LowPass local_68;
  
  local_68.super_RBJbase.super_Biquad.m_a0 = 1.0;
  local_68.super_RBJbase.super_Biquad.m_a1 = 0.0;
  local_68.super_RBJbase.super_Biquad.m_a2 = 0.0;
  local_68.super_RBJbase.super_Biquad.m_b1 = 0.0;
  local_68.super_RBJbase.super_Biquad.m_b2 = 0.0;
  local_68.super_RBJbase.super_Biquad.m_b0 = 1.0;
  local_68.super_RBJbase.state.m_x2 = 0.0;
  local_68.super_RBJbase.state.m_y2 = 0.0;
  local_68.super_RBJbase.state.m_x1 = 0.0;
  local_68.super_RBJbase.state.m_y1 = 0.0;
  Iir::RBJ::LowPass::setupN(&local_68,0.005,1.0);
  iVar1 = 10000;
  dVar5 = local_68.super_RBJbase.state.m_x2;
  dVar6 = local_68.super_RBJbase.state.m_y2;
  do {
    local_68.super_RBJbase.state.m_y2 = local_68.super_RBJbase.state.m_y1;
    local_68.super_RBJbase.state.m_x2 = local_68.super_RBJbase.state.m_x1;
    local_68.super_RBJbase.state.m_x1 = 1.0;
    if (iVar1 != 0x2706) {
      local_68.super_RBJbase.state.m_x1 = 0.0;
    }
    dVar4 = dVar6 * -local_68.super_RBJbase.super_Biquad.m_a2 +
            -local_68.super_RBJbase.super_Biquad.m_a1 * local_68.super_RBJbase.state.m_y2 +
            dVar5 * local_68.super_RBJbase.super_Biquad.m_b2 +
            local_68.super_RBJbase.super_Biquad.m_b0 * local_68.super_RBJbase.state.m_x1 +
            local_68.super_RBJbase.super_Biquad.m_b1 * local_68.super_RBJbase.state.m_x2;
    local_68.super_RBJbase.state.m_y1 = dVar4;
    if (NAN(dVar4)) {
      pcVar2 = "Lowpass output is NAN\n";
      goto LAB_0010173a;
    }
    iVar1 = iVar1 + -1;
    dVar5 = local_68.super_RBJbase.state.m_x2;
    dVar6 = local_68.super_RBJbase.state.m_y2;
  } while (iVar1 != 0);
  local_68.super_RBJbase.state.m_x1 = 0.0;
  this = _stderr;
  fprintf(_stderr,"%e\n");
  dVar4 = ABS(dVar4);
  if (dVar4 < 1e-15) {
    local_b8.super_RBJbase.super_Biquad.m_a0 = 1.0;
    local_b8.super_RBJbase.super_Biquad.m_a1 = 0.0;
    local_b8.super_RBJbase.super_Biquad.m_a2 = 0.0;
    local_b8.super_RBJbase.super_Biquad.m_b1 = 0.0;
    local_b8.super_RBJbase.super_Biquad.m_b2 = 0.0;
    local_b8.super_RBJbase.super_Biquad.m_b0 = 1.0;
    local_b8.super_RBJbase.state.m_x2 = 0.0;
    local_b8.super_RBJbase.state.m_y2 = 0.0;
    local_b8.super_RBJbase.state.m_x1 = 0.0;
    local_b8.super_RBJbase.state.m_y1 = 0.0;
    Iir::RBJ::BandStop::setupN(&local_b8,0.05,0.005);
    iVar1 = 100000;
    dVar5 = local_b8.super_RBJbase.state.m_x2;
    dVar6 = local_b8.super_RBJbase.state.m_y2;
    do {
      local_b8.super_RBJbase.state.m_y2 = local_b8.super_RBJbase.state.m_y1;
      local_b8.super_RBJbase.state.m_x2 = local_b8.super_RBJbase.state.m_x1;
      local_b8.super_RBJbase.state.m_x1 = 1.0;
      if (iVar1 != 0x18696) {
        local_b8.super_RBJbase.state.m_x1 = 0.0;
      }
      dVar4 = dVar6 * -local_b8.super_RBJbase.super_Biquad.m_a2 +
              -local_b8.super_RBJbase.super_Biquad.m_a1 * local_b8.super_RBJbase.state.m_y2 +
              dVar5 * local_b8.super_RBJbase.super_Biquad.m_b2 +
              local_b8.super_RBJbase.super_Biquad.m_b0 * local_b8.super_RBJbase.state.m_x1 +
              local_b8.super_RBJbase.super_Biquad.m_b1 * local_b8.super_RBJbase.state.m_x2;
      local_b8.super_RBJbase.state.m_y1 = dVar4;
      if (NAN(dVar4)) {
        pcVar2 = "Bandstop output is NAN\n";
LAB_0010173a:
        fprintf(_stderr,"%s\n",pcVar2);
        exit(-1);
      }
      iVar1 = iVar1 + -1;
      dVar5 = local_b8.super_RBJbase.state.m_x2;
      dVar6 = local_b8.super_RBJbase.state.m_y2;
    } while (iVar1 != 0);
    local_b8.super_RBJbase.state.m_x1 = 0.0;
    this = _stderr;
    fprintf(_stderr,"%e\n");
    dVar4 = ABS(dVar4);
    if (1e-15 <= dVar4) goto LAB_00101755;
    uVar3 = 0;
    while( true ) {
      dVar5 = sin((double)(int)uVar3 * 0.3141592653589793);
      dVar6 = ((local_b8.super_RBJbase.super_Biquad.m_b2 * local_b8.super_RBJbase.state.m_x2 +
               local_b8.super_RBJbase.super_Biquad.m_b0 * dVar5 +
               local_b8.super_RBJbase.super_Biquad.m_b1 * local_b8.super_RBJbase.state.m_x1) -
              local_b8.super_RBJbase.state.m_y1 * local_b8.super_RBJbase.super_Biquad.m_a1) -
              local_b8.super_RBJbase.super_Biquad.m_a2 * local_b8.super_RBJbase.state.m_y2;
      local_b8.super_RBJbase.state.m_x2 = local_b8.super_RBJbase.state.m_x1;
      local_b8.super_RBJbase.state.m_y2 = local_b8.super_RBJbase.state.m_y1;
      if ((50000 < uVar3) && (dVar4 = 1e-05, 1e-05 <= ABS(dVar6))) break;
      uVar3 = uVar3 + 1;
      local_b8.super_RBJbase.state.m_x1 = dVar5;
      local_b8.super_RBJbase.state.m_y1 = dVar6;
      if (uVar3 == 100000) {
        fprintf(_stderr,"%e\n");
        return 0;
      }
    }
    local_b8.super_RBJbase.state.m_x1 = dVar5;
    local_b8.super_RBJbase.state.m_y1 = dVar6;
    main_cold_1();
  }
  main_cold_3();
LAB_00101755:
  main_cold_2();
  dVar5 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) * 6.283185307179586;
  dVar6 = cos(dVar5);
  dVar5 = sin(dVar5);
  dVar5 = dVar5 / (dVar4 + dVar4);
  dVar4 = (1.0 - dVar6) * 0.5;
  Iir::Biquad::setCoefficients
            ((Biquad *)this,dVar5 + 1.0,dVar6 * -2.0,1.0 - dVar5,dVar4,1.0 - dVar6,dVar4);
  return extraout_EAX;
}

Assistant:

int main(int, char**)
{
	Iir::RBJ::LowPass f;
	const double samplingrate = 1000; // Hz
	const double cutoff_frequency = 5; // Hz
	const double qfactor = 1;
	f.setup(samplingrate, cutoff_frequency, qfactor);
	double b;
	for (int i = 0; i < 10000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		b = f.filter(a);
		//fprintf(stdout,"%e\n",b);
		assert_print(!isnan(b), "Lowpass output is NAN\n");
	}
	fprintf(stderr, "%e\n", b);
	assert_print(fabs(b) < 1E-15, "Lowpass value for t->inf to high!");

	Iir::RBJ::BandStop bs;
	const double center_frequency = 0.05;
	const double frequency_width = 0.005;
	bs.setupN(center_frequency, frequency_width);
	for (int i = 0; i < 100000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		b = bs.filter(a);
		assert_print(!isnan(b), "Bandstop output is NAN\n");
	}
	fprintf(stderr, "%e\n", b);
	assert_print(fabs(b) < 1E-15, "Bandstop value for t->inf to high!");

	for (int i = 0; i < 100000; i++)
	{
		b = fabs(bs.filter(sin(2 * M_PI*center_frequency*i)));
		if (i > 50000) {
			assert_print(b < 1E-5, "Bandstop not removing sine.");
		}
	}
	fprintf(stderr, "%e\n", b);
	return 0;
}